

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3PoslistPhraseMerge(char **pp,int nToken,int isSaveLeft,int isExact,char **pp1,char **pp2)

{
  long lVar1;
  bool bVar2;
  sqlite3_int64 sVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  byte *pbVar12;
  byte *pbVar13;
  long in_FS_OFFSET;
  sqlite3_int64 iPos2;
  sqlite3_int64 iPos1;
  sqlite3_int64 iPrev;
  int iCol2;
  int iCol1;
  byte *local_50;
  byte *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = *pp;
  local_48 = (byte *)*pp1;
  pbVar12 = (byte *)*pp2;
  iCol1 = 0;
  iCol2 = 0;
  local_50 = pbVar12;
  if (*local_48 == 1) {
    pbVar13 = local_48 + 1;
    if ((char)local_48[1] < '\0') {
      uVar5 = sqlite3Fts3GetVarint32((char *)pbVar13,&iCol1);
      uVar6 = (ulong)uVar5;
    }
    else {
      uVar6 = 1;
      iCol1 = (int)(char)local_48[1];
    }
    local_48 = pbVar13 + uVar6;
    if (iCol1 != 0) goto LAB_001b328d;
LAB_001b3581:
    iVar4 = 0;
  }
  else {
LAB_001b328d:
    iVar4 = iCol1;
    iVar9 = 0;
    if (*pbVar12 == 1) {
      if ((char)pbVar12[1] < '\0') {
        uVar5 = sqlite3Fts3GetVarint32((char *)(pbVar12 + 1),&iCol2);
        uVar6 = (ulong)uVar5;
      }
      else {
        uVar6 = 1;
        iCol2 = (int)(char)pbVar12[1];
      }
      local_50 = pbVar12 + 1 + uVar6;
      iVar9 = iCol2;
      if (iCol2 == 0) goto LAB_001b3581;
    }
    while( true ) {
      while (pcVar11 = local_40, iVar4 != iVar9) {
        if (iVar9 <= iVar4) {
          fts3ColumnlistCopy((char **)0x0,(char **)&local_50);
          pbVar12 = local_50;
          lVar8 = iPos2;
          if (*local_50 != 0) goto LAB_001b34db;
          goto LAB_001b352e;
        }
        fts3ColumnlistCopy((char **)0x0,(char **)&local_48);
        lVar8 = iPos2;
        if (*local_48 == 0) goto LAB_001b352e;
        pbVar12 = local_48 + 1;
        if ((char)local_48[1] < '\0') {
          uVar5 = sqlite3Fts3GetVarint32((char *)pbVar12,&iCol1);
          uVar6 = (ulong)uVar5;
        }
        else {
          uVar6 = 1;
          iCol1 = (int)(char)local_48[1];
        }
        local_48 = pbVar12 + uVar6;
        iVar4 = iCol1;
        iVar9 = iCol2;
      }
      iPrev = 0;
      iPos1 = 0;
      iPos2 = 0;
      if (iVar9 != 0) {
        *local_40 = '\x01';
        iVar4 = sqlite3Fts3PutVarint(local_40 + 1,(long)iVar9);
        local_40 = pcVar11 + (long)iVar4 + 1;
      }
      fts3GetDeltaVarint((char **)&local_48,&iPos1);
      sVar3 = iPos1;
      lVar10 = iPos1 + -2;
      iPos1 = lVar10;
      fts3GetDeltaVarint((char **)&local_50,&iPos2);
      lVar8 = iPos2 + -2;
      if ((sVar3 < 2) || (bVar2 = iPos2 < 2, iPos2 = lVar8, bVar2)) break;
      while( true ) {
        lVar1 = nToken + lVar10;
        while( true ) {
          if ((lVar8 == lVar1) || (((isExact == 0 && (lVar10 < lVar8)) && (lVar8 <= lVar1)))) {
            lVar7 = lVar10;
            if (isSaveLeft == 0) {
              lVar7 = lVar8;
            }
            fts3PutDeltaVarint(&local_40,&iPrev,lVar7 + 2);
            iPrev = iPrev + -2;
            pcVar11 = (char *)0x0;
          }
          if ((lVar10 < lVar8) && (isSaveLeft != 0 || lVar1 < lVar8)) break;
          if (*local_50 < 2) goto LAB_001b3459;
          fts3GetDeltaVarint((char **)&local_50,&iPos2);
          lVar8 = iPos2 + -2;
          iPos2 = lVar8;
        }
        if (*local_48 < 2) break;
        fts3GetDeltaVarint((char **)&local_48,&iPos1);
        lVar10 = iPos1 + -2;
        iPos1 = lVar10;
      }
LAB_001b3459:
      if (pcVar11 != (char *)0x0) {
        local_40 = pcVar11;
      }
      fts3ColumnlistCopy((char **)0x0,(char **)&local_48);
      fts3ColumnlistCopy((char **)0x0,(char **)&local_50);
      pbVar12 = local_50;
      lVar8 = iPos2;
      if ((*local_48 == 0) || (*local_50 == 0)) break;
      pbVar13 = local_48 + 1;
      if ((char)local_48[1] < '\0') {
        uVar5 = sqlite3Fts3GetVarint32((char *)pbVar13,&iCol1);
        uVar6 = (ulong)uVar5;
      }
      else {
        uVar6 = 1;
        iCol1 = (int)(char)local_48[1];
      }
      local_48 = pbVar13 + uVar6;
LAB_001b34db:
      if ((char)pbVar12[1] < '\0') {
        uVar5 = sqlite3Fts3GetVarint32((char *)(pbVar12 + 1),&iCol2);
        uVar6 = (ulong)uVar5;
      }
      else {
        uVar6 = 1;
        iCol2 = (int)(char)pbVar12[1];
      }
      local_50 = pbVar12 + 1 + uVar6;
      iVar4 = iCol1;
      iVar9 = iCol2;
    }
LAB_001b352e:
    iPos2 = lVar8;
    iVar4 = 0;
    fts3PoslistCopy((char **)0x0,(char **)&local_50);
    fts3PoslistCopy((char **)0x0,(char **)&local_48);
    *pp1 = (char *)local_48;
    *pp2 = (char *)local_50;
    if (*pp != local_40) {
      *local_40 = '\0';
      *pp = local_40 + 1;
      iVar4 = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int fts3PoslistPhraseMerge(
  char **pp,                      /* IN/OUT: Preallocated output buffer */
  int nToken,                     /* Maximum difference in token positions */
  int isSaveLeft,                 /* Save the left position */
  int isExact,                    /* If *pp1 is exactly nTokens before *pp2 */
  char **pp1,                     /* IN/OUT: Left input list */
  char **pp2                      /* IN/OUT: Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;
  int iCol1 = 0;
  int iCol2 = 0;

  /* Never set both isSaveLeft and isExact for the same invocation. */
  assert( isSaveLeft==0 || isExact==0 );

  assert_fts3_nc( p!=0 && *p1!=0 && *p2!=0 );
  if( *p1==POS_COLUMN ){
    p1++;
    p1 += fts3GetVarint32(p1, &iCol1);
    /* iCol1==0 indicates corruption. Column 0 does not have a POS_COLUMN
    ** entry, so this is actually end-of-doclist. */
    if( iCol1==0 ) return 0;
  }
  if( *p2==POS_COLUMN ){
    p2++;
    p2 += fts3GetVarint32(p2, &iCol2);
    /* As above, iCol2==0 indicates corruption. */
    if( iCol2==0 ) return 0;
  }

  while( 1 ){
    if( iCol1==iCol2 ){
      char *pSave = p;
      sqlite3_int64 iPrev = 0;
      sqlite3_int64 iPos1 = 0;
      sqlite3_int64 iPos2 = 0;

      if( iCol1 ){
        *p++ = POS_COLUMN;
        p += sqlite3Fts3PutVarint(p, iCol1);
      }

      fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
      fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;
      if( iPos1<0 || iPos2<0 ) break;

      while( 1 ){
        if( iPos2==iPos1+nToken
         || (isExact==0 && iPos2>iPos1 && iPos2<=iPos1+nToken)
        ){
          sqlite3_int64 iSave;
          iSave = isSaveLeft ? iPos1 : iPos2;
          fts3PutDeltaVarint(&p, &iPrev, iSave+2); iPrev -= 2;
          pSave = 0;
          assert( p );
        }
        if( (!isSaveLeft && iPos2<=(iPos1+nToken)) || iPos2<=iPos1 ){
          if( (*p2&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;
        }else{
          if( (*p1&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
        }
      }

      if( pSave ){
        assert( pp && p );
        p = pSave;
      }

      fts3ColumnlistCopy(0, &p1);
      fts3ColumnlistCopy(0, &p2);
      assert( (*p1&0xFE)==0 && (*p2&0xFE)==0 );
      if( 0==*p1 || 0==*p2 ) break;

      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }

    /* Advance pointer p1 or p2 (whichever corresponds to the smaller of
    ** iCol1 and iCol2) so that it points to either the 0x00 that marks the
    ** end of the position list, or the 0x01 that precedes the next
    ** column-number in the position list.
    */
    else if( iCol1<iCol2 ){
      fts3ColumnlistCopy(0, &p1);
      if( 0==*p1 ) break;
      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
    }else{
      fts3ColumnlistCopy(0, &p2);
      if( 0==*p2 ) break;
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }
  }

  fts3PoslistCopy(0, &p2);
  fts3PoslistCopy(0, &p1);
  *pp1 = p1;
  *pp2 = p2;
  if( *pp==p ){
    return 0;
  }
  *p++ = 0x00;
  *pp = p;
  return 1;
}